

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_string::append
          (xpath_string *this,xpath_string *o,xpath_allocator *alloc)

{
  size_t __n;
  size_t __n_00;
  char_t *pcVar1;
  
  if (*o->_buffer != '\0') {
    if (((*this->_buffer == '\0') && (this->_uses_heap == false)) && (o->_uses_heap == false)) {
      this->_buffer = o->_buffer;
    }
    else {
      __n = length(this);
      __n_00 = length(o);
      if (this->_uses_heap == false) {
        pcVar1 = (char_t *)0x0;
      }
      else {
        pcVar1 = this->_buffer;
      }
      pcVar1 = (char_t *)xpath_allocator::reallocate(alloc,pcVar1,__n + 1,__n_00 + __n + 1);
      if (pcVar1 != (char_t *)0x0) {
        if (this->_uses_heap == false) {
          memcpy(pcVar1,this->_buffer,__n);
        }
        memcpy(pcVar1 + __n,o->_buffer,__n_00);
        pcVar1[__n_00 + __n] = '\0';
        this->_buffer = pcVar1;
        this->_uses_heap = true;
        this->_length_heap = __n_00 + __n;
      }
    }
  }
  return;
}

Assistant:

void append(const xpath_string& o, xpath_allocator* alloc)
		{
			// skip empty sources
			if (!*o._buffer) return;

			// fast append for constant empty target and constant source
			if (!*_buffer && !_uses_heap && !o._uses_heap)
			{
				_buffer = o._buffer;
			}
			else
			{
				// need to make heap copy
				size_t target_length = length();
				size_t source_length = o.length();
				size_t result_length = target_length + source_length;

				// allocate new buffer
				char_t* result = static_cast<char_t*>(alloc->reallocate(_uses_heap ? const_cast<char_t*>(_buffer) : 0, (target_length + 1) * sizeof(char_t), (result_length + 1) * sizeof(char_t)));
				if (!result) return;

				// append first string to the new buffer in case there was no reallocation
				if (!_uses_heap) memcpy(result, _buffer, target_length * sizeof(char_t));

				// append second string to the new buffer
				memcpy(result + target_length, o._buffer, source_length * sizeof(char_t));
				result[result_length] = 0;

				// finalize
				_buffer = result;
				_uses_heap = true;
				_length_heap = result_length;
			}
		}